

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsTagAddDescriptions
              (FmsTag tag,FmsIntType tag_type,void *tags,char **tag_descr,FmsInt num_tags)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  FmsInt FVar4;
  FmsIntType dst_type;
  char **str_copy_p;
  char **local_60;
  void *local_40;
  
  if (tag == (FmsTag)0x0) {
    return 1;
  }
  if (FMS_INT_TYPE < tag_type) {
    return 2;
  }
  dst_type = tag->tag_type;
  if ((ulong)dst_type == 8) {
    return 3;
  }
  if (num_tags != 0) {
    if (tags == (void *)0x0) {
      return 4;
    }
    if (tag_descr == (char **)0x0) {
      return 5;
    }
    uVar1 = tag->num_tag_descriptions;
    local_40 = tag->described_tags;
    local_60 = tag->tag_descriptions;
    sVar2 = FmsIntTypeSize[dst_type];
    FVar4 = NextPow2(uVar1 + num_tags);
    if (uVar1 <= FVar4 >> 1) {
      local_40 = realloc(local_40,FVar4 * sVar2);
      if (local_40 == (void *)0x0) {
        return 6;
      }
      tag->described_tags = local_40;
      local_60 = (char **)realloc(local_60,FVar4 << 3);
      if (local_60 == (char **)0x0) {
        return 6;
      }
      tag->tag_descriptions = local_60;
      dst_type = tag->tag_type;
    }
    FmsIntConvertCopy(tag_type,tags,dst_type,(void *)(sVar2 * uVar1 + (long)local_40),num_tags);
    str_copy_p = local_60 + uVar1;
    for (FVar4 = 0; num_tags != FVar4; FVar4 = FVar4 + 1) {
      iVar3 = FmsCopyString(tag_descr[FVar4],str_copy_p);
      if (iVar3 != 0) {
        while (FVar4 != 0) {
          free(local_60[uVar1 + (FVar4 - 1)]);
          FVar4 = FVar4 - 1;
        }
        return 6;
      }
      str_copy_p = str_copy_p + 1;
    }
    tag->num_tag_descriptions = uVar1 + num_tags;
  }
  return 0;
}

Assistant:

int FmsTagAddDescriptions(FmsTag tag, FmsIntType tag_type, const void *tags,
                          const char *const *tag_descr, FmsInt num_tags) {
  if (!tag) { E_RETURN(1); }
  if (tag_type >= FMS_NUM_INT_TYPES) { E_RETURN(2); }
  if (tag->tag_type == FMS_NUM_INT_TYPES) { E_RETURN(3); }
  if (num_tags == 0) { return 0; }
  if (tags == NULL) { E_RETURN(4); }
  if (tag_descr == NULL) { E_RETURN(5); }
  const FmsInt num_tag_descriptions = tag->num_tag_descriptions;
  char *described_tags = tag->described_tags;
  char **tag_descriptions = tag->tag_descriptions;
  const size_t sizeof_tag_type = FmsIntTypeSize[tag->tag_type];
  const FmsInt nc = NextPow2(num_tag_descriptions + num_tags);
  if (num_tag_descriptions <= nc/2) {
    described_tags = realloc(described_tags, nc*sizeof_tag_type);
    if (described_tags == NULL) { E_RETURN(6); }
    tag->described_tags = described_tags;
    tag_descriptions = realloc(tag_descriptions, nc*sizeof(char*));
    if (tag_descriptions == NULL) { E_RETURN(6); }
    tag->tag_descriptions = tag_descriptions;
  }
  // Copy the new described tags
  FmsIntConvertCopy(tag_type, tags, tag->tag_type,
                    described_tags + num_tag_descriptions*sizeof_tag_type,
                    num_tags);
  // Copy the new description strings
  for (FmsInt i = 0; i < num_tags; i++) {
    if (FmsCopyString(tag_descr[i],
                      &tag_descriptions[num_tag_descriptions + i])) {
      while (i != 0) {
        free(tag_descriptions[num_tag_descriptions + (--i)]);
      }
      E_RETURN(6);
    }
  }
  // Update tag
  tag->num_tag_descriptions = num_tag_descriptions + num_tags;
  return 0;
}